

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
mvm::test::test_instr_set::randn
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          test_instr_set *this,ui32 n)

{
  iterator __position;
  allocator_type local_19;
  uint local_18;
  value_type_conflict3 local_14;
  
  local_18 = 4;
  __position._M_current =
       (this->call_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->call_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->call_stack,__position,&local_18);
  }
  else {
    *__position._M_current = 4;
    (this->call_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_14 = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(ulong)n,&local_14,&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ui32> randn(ui32 n) {
    call_stack.push_back(4);
    return std::vector<ui32>(n, 1);
  }